

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::connect
          (ConcurrencyLimitingHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  void *pvVar2;
  int __flags;
  undefined4 in_register_0000000c;
  undefined8 uVar3;
  StringPtr *params;
  void *__child_stack;
  undefined4 in_register_00000034;
  ConcurrencyLimitingHttpClient *this_00;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6560:15)>
  *location_01;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  void *continuationTracePtr;
  ConnectRequest response;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_140;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  local_138;
  PromiseBase local_120;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
  local_118;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_108;
  code *local_100;
  char *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  sockaddr *local_e0;
  undefined8 local_d8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d0;
  anon_class_144_4_7ef71648_for_func local_c8;
  undefined1 local_38;
  undefined8 local_30;
  
  this_00 = (ConcurrencyLimitingHttpClient *)CONCAT44(in_register_00000034,__fd);
  uVar3 = CONCAT44(in_register_0000000c,__len);
  local_e0 = __addr;
  local_d8 = uVar3;
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    this_00->concurrentRequests = this_00->concurrentRequests + 1;
    local_38 = *in_R9;
    local_30 = *(undefined8 *)(in_R9 + 8);
    local_138.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this_00;
    (*this_00->inner->_vptr_HttpClient[2])(&local_c8);
    fireCountChanged(this_00);
    attachCounter((ConnectRequest *)this,(ConnectRequest *)&local_c8,(ConnectionCounter *)&local_138
                 );
    HttpClient::ConnectRequest::~ConnectRequest((ConnectRequest *)&local_c8);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_138);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffeb0;
    location.fileName = (char *)in_stack_fffffffffffffea8;
    location._16_8_ = in_stack_fffffffffffffeb8;
    __arg = in_R8;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (&local_138,location);
    __flags = (int)uVar3;
    local_c8.this = this_00;
    str<kj::StringPtr&>(&local_c8.host,(kj *)&local_e0,params);
    HttpHeaders::clone(&local_c8.headers,in_R8,__child_stack,__flags,__arg);
    local_c8.settings.useTls = (bool)*in_R9;
    local_c8.settings.tlsStarter.ptr =
         *(Maybe<kj::Function<kj::Promise<void>_(kj::StringPtr)>_> **)(in_R9 + 8);
    local_100 = kj::_::
                SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6560:15)>
                ::anon_class_144_4_7ef71648_for_func::operator();
    pPVar1 = ((PromiseArenaMember *)local_138.promise.super_PromiseBase.node.ptr)->arena;
    if (pPVar1 == (PromiseArena *)0x0 ||
        (ulong)((long)local_138.promise.super_PromiseBase.node.ptr - (long)pPVar1) < 0xb0) {
      pvVar2 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6560:15)>
                     *)((long)pvVar2 + 0x350);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138,&local_c8
                 ,&local_100);
      *(void **)((long)pvVar2 + 0x358) = pvVar2;
    }
    else {
      ((PromiseArenaMember *)local_138.promise.super_PromiseBase.node.ptr)->arena =
           (PromiseArena *)0x0;
      location_01 = (SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6560:15)>
                     *)((long)local_138.promise.super_PromiseBase.node.ptr + -0xb0);
      ctor<kj::_::SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138,&local_c8
                 ,&local_100);
      (((PromiseNode *)((long)local_138.promise.super_PromiseBase.node.ptr + -0xb0))->
      super_PromiseArenaMember).arena = pPVar1;
    }
    local_108.ptr = (PromiseNode *)0x0;
    local_d0.ptr = (PromiseNode *)0x0;
    local_140.ptr = (PromiseNode *)location_01;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_108);
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_f0 = "connect";
    local_e8 = 0x120000199f;
    location_00.function = "connect";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0x199f;
    location_00.columnNumber = 0x12;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)&local_118,location_00);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_c8);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,&local_138.fulfiller);
    fireCountChanged(this_00);
    local_120.node.ptr =
         (OwnPromiseNode)
         (OwnPromiseNode)
         local_118.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ;
    (this->super_HttpClient)._vptr_HttpClient =
         (_func_int **)
         local_118.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.
         value.super_PromiseBase.node.ptr;
    local_118.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
    super_PromiseBase.node.ptr = (Promise<kj::HttpClient::ConnectRequest::Status>)(PromiseBase)0x0;
    local_118.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>.
    value.super_PromiseBase.node.ptr =
         (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)(PromiseBase)0x0;
    newPromisedStream((kj *)&this->inner,
                      (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_120);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120.node);
    kj::_::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ::~TupleImpl(&local_118);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair(&local_138);
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const kj::HttpHeaders& headers, HttpConnectSettings settings) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.connect(host, headers, settings);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();

    auto split = paf.promise
        .then([this, host=kj::str(host), headers=headers.clone(), settings]
              (ConnectionCounter&& counter) mutable
                  -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                               kj::Promise<kj::Own<kj::AsyncIoStream>>> {
      auto request = attachCounter(inner.connect(host, headers, settings), kj::mv(counter));
      return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
    }).split();

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::newPromisedStream(kj::mv(kj::get<1>(split)))
    };
  }